

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devexpricing.hpp
# Opt level: O0

HighsInt __thiscall DevexPricing::chooseconstrainttodrop(DevexPricing *this,QpVector *lambda)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  BasisStatus BVar4;
  vector<int,_std::allocator<int>_> *__x;
  size_type sVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  long in_RSI;
  long in_RDI;
  double dVar9;
  double val;
  HighsInt indexinbasis;
  size_t i;
  double maxabslambda;
  HighsInt minidx;
  vector<int,_std::allocator<int>_> constraintindexinbasisfactor;
  vector<int,_std::allocator<int>_> active_constraint_index;
  HighsInt in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff50;
  BasisStatus in_stack_ffffffffffffff54;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  ulong local_60;
  double local_58;
  HighsInt local_50;
  vector<int,_std::allocator<int>_> local_40;
  vector<int,_std::allocator<int>_> local_28;
  long local_10;
  
  local_10 = in_RSI;
  Basis::getactive(*(Basis **)(in_RDI + 0x10));
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __x = Basis::getindexinfactor(*(Basis **)(in_RDI + 0x10));
  std::vector<int,_std::allocator<int>_>::vector(in_stack_ffffffffffffff90,__x);
  local_50 = -1;
  local_58 = 0.0;
  for (local_60 = 0; sVar5 = std::vector<int,_std::allocator<int>_>::size(&local_28),
      local_60 < sVar5; local_60 = local_60 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,local_60);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)*pvVar6);
    iVar3 = *pvVar6;
    if (iVar3 == -1) {
      printf("error\n");
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),(long)iVar3);
    dVar9 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),(long)iVar3);
    dVar2 = *pvVar7;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)iVar3);
    dVar9 = (dVar9 * dVar2) / *pvVar8;
    if ((local_58 < dVar9) &&
       (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),(long)iVar3
                           ), pdVar1 = (double *)(*(long *)(in_RDI + 8) + 0x838),
       *pdVar1 <= ABS(*pvVar7) && ABS(*pvVar7) != *pdVar1)) {
      std::vector<int,_std::allocator<int>_>::operator[](&local_28,local_60);
      BVar4 = Basis::getstatus((Basis *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ),in_stack_ffffffffffffff3c);
      if ((BVar4 != kActiveAtLower) ||
         (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                              (long)iVar3), -*pvVar7 <= 0.0)) {
        std::vector<int,_std::allocator<int>_>::operator[](&local_28,local_60);
        in_stack_ffffffffffffff54 =
             Basis::getstatus((Basis *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40)
                              ,in_stack_ffffffffffffff3c);
        if ((in_stack_ffffffffffffff54 == kActiveAtUpper) &&
           (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_10 + 0x20),
                                (long)iVar3), 0.0 < *pvVar7)) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,local_60);
          local_50 = *pvVar6;
          local_58 = dVar9;
        }
      }
      else {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_28,local_60);
        local_50 = *pvVar6;
        local_58 = dVar9;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return local_50;
}

Assistant:

HighsInt chooseconstrainttodrop(const QpVector& lambda) {
    auto active_constraint_index = basis.getactive();
    auto constraintindexinbasisfactor = basis.getindexinfactor();

    HighsInt minidx = -1;
    double maxabslambda = 0.0;
    for (size_t i = 0; i < active_constraint_index.size(); i++) {
      HighsInt indexinbasis =
          constraintindexinbasisfactor[active_constraint_index[i]];
      if (indexinbasis == -1) {
        printf("error\n");
      }
      assert(indexinbasis != -1);

      double val = lambda.value[indexinbasis] * lambda.value[indexinbasis] /
                   weights[indexinbasis];
      if (val > maxabslambda && fabs(lambda.value[indexinbasis]) >
                                    runtime.settings.lambda_zero_threshold) {
        if (basis.getstatus(active_constraint_index[i]) ==
                BasisStatus::kActiveAtLower &&
            -lambda.value[indexinbasis] > 0) {
          minidx = active_constraint_index[i];
          maxabslambda = val;
        } else if (basis.getstatus(active_constraint_index[i]) ==
                       BasisStatus::kActiveAtUpper &&
                   lambda.value[indexinbasis] > 0) {
          minidx = active_constraint_index[i];
          maxabslambda = val;
        } else {
          // TODO
        }
      }
    }

    return minidx;
  }